

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

string * __thiscall
Character::GuildRankString_abi_cxx11_(string *__return_storage_ptr__,Character *this)

{
  World *pWVar1;
  size_type sVar2;
  bool bVar3;
  mapped_type *this_00;
  allocator<char> local_41;
  key_type local_40;
  
  if ((this->guild).super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_40);
  }
  else {
    pWVar1 = this->world;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"GuildCustomRanks",&local_41);
    this_00 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pWVar1->config,&local_40);
    bVar3 = util::variant::GetBool(this_00);
    if (bVar3) {
      sVar2 = (this->guild_rank_string)._M_string_length;
      std::__cxx11::string::~string((string *)&local_40);
      if (sVar2 != 0) {
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,(string *)&this->guild_rank_string);
        return __return_storage_ptr__;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&local_40);
    }
    Guild::GetRank_abi_cxx11_
              (__return_storage_ptr__,
               (this->guild).super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (uint)this->guild_rank);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Character::GuildRankString()
{
	if (!this->guild)
		return "";

	if (this->world->config["GuildCustomRanks"] && !this->guild_rank_string.empty())
	{
		return this->guild_rank_string;
	}
	else
	{
		return this->guild->GetRank(this->guild_rank);
	}
}